

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

trex * __thiscall
fmp4_stream::init_fragment::get_trex(trex *__return_storage_ptr__,init_fragment *this)

{
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uchar *local_90 [2];
  uchar local_80 [16];
  uchar *local_70 [2];
  uchar local_60 [16];
  uchar *local_50 [2];
  uchar local_40 [16];
  
  puVar2 = (this->moov_box_).box_data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 8;
  bVar6 = false;
  do {
    uVar4 = (ulong)uVar5;
    if ((ulong)((long)(this->moov_box_).box_data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->moov_box_).box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar4) {
      bVar6 = false;
      goto LAB_00113dd1;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"trak","");
    if ((((puVar2[uVar4 + 4] != *local_50[0]) || (puVar2[uVar4 + 5] != local_50[0][1])) ||
        (puVar2[uVar4 + 6] != local_50[0][2])) ||
       (bVar3 = true, puVar2[uVar4 + 7] != local_50[0][3])) {
      bVar3 = false;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (bVar3) {
      bVar6 = true;
    }
    else {
      uVar1 = *(uint *)(puVar2 + uVar4);
      uVar5 = uVar5 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
    }
  } while (!bVar6);
  uVar5 = uVar5 + 8;
  bVar6 = false;
  do {
    uVar4 = (ulong)uVar5;
    if ((ulong)((long)(this->moov_box_).box_data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->moov_box_).box_data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) <= uVar4) break;
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"mvex","");
    if (((puVar2[uVar4 + 4] != *local_70[0]) || (puVar2[uVar4 + 5] != local_70[0][1])) ||
       ((puVar2[uVar4 + 6] != local_70[0][2] || (bVar3 = true, puVar2[uVar4 + 7] != local_70[0][3]))
       )) {
      bVar3 = false;
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (bVar3) {
      bVar6 = true;
    }
    else {
      uVar1 = *(uint *)(puVar2 + uVar4);
      uVar5 = uVar5 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                      uVar1 << 0x18);
    }
  } while (!bVar6);
LAB_00113dd1:
  if (bVar6) {
    uVar5 = uVar5 + 8;
    bVar6 = false;
    do {
      uVar4 = (ulong)uVar5;
      if ((ulong)((long)(this->moov_box_).box_data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->moov_box_).box_data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) <= uVar4) break;
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"trex","");
      if (((puVar2[uVar4 + 4] != *local_90[0]) || (puVar2[uVar4 + 5] != local_90[0][1])) ||
         ((puVar2[uVar4 + 6] != local_90[0][2] ||
          (bVar3 = true, puVar2[uVar4 + 7] != local_90[0][3])))) {
        bVar3 = false;
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      if (bVar3) {
        bVar6 = true;
      }
      else {
        uVar1 = *(uint *)(puVar2 + uVar4);
        uVar5 = uVar5 + (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18);
      }
    } while (!bVar6);
  }
  else {
    bVar6 = false;
  }
  __return_storage_ptr__->track_id_ = 0;
  __return_storage_ptr__->default_sample_description_index_ = 0;
  __return_storage_ptr__->default_sample_duration_ = 0;
  __return_storage_ptr__->default_sample_size_ = 0;
  __return_storage_ptr__->default_sample_flags_ = 0;
  if (bVar6) {
    uVar4 = (ulong)uVar5;
    uVar5 = *(uint *)(puVar2 + uVar4 + 0xc);
    __return_storage_ptr__->track_id_ =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = *(uint *)(puVar2 + uVar4 + 0x10);
    __return_storage_ptr__->default_sample_description_index_ =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = *(uint *)(puVar2 + uVar4 + 0x14);
    __return_storage_ptr__->default_sample_duration_ =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = *(uint *)(puVar2 + uVar4 + 0x18);
    __return_storage_ptr__->default_sample_size_ =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    uVar5 = *(uint *)(puVar2 + uVar4 + 0x1c);
    __return_storage_ptr__->default_sample_flags_ =
         uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

trex init_fragment::get_trex()
	{
		char* ptr = (char*)moov_box_.box_data_.data();
		bool trak_found = false;
		bool mvex_found = false;
		bool trex_found = false;


		uint32_t pos = 8;

		// find trak box 
		while (!trak_found && pos < moov_box_.box_data_.size())
		{
			if (f_compare_4cc(ptr + 4 + pos, "trak"))
				trak_found = true;
			else
				pos += fmp4_read_uint32(ptr + pos);
		}
		if (trak_found)
		{
			pos += 8;
			while (!mvex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "mvex"))
					mvex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (mvex_found)
		{
			pos += 8;
			while (!trex_found && pos < moov_box_.box_data_.size())
			{
				if (f_compare_4cc(ptr + 4 + pos, "trex"))
					trex_found = true;
				else
					pos += fmp4_read_uint32(ptr + pos);
			};
		}
		if (trex_found)
		{
			trex t = {}; 
			// uint32_t track_id_;
			// uint32_t default_sample_description_index_;
			// uint32_t default_sample_duration_;
			// uint32_t default_sample_size_;
			// uint32_t default_sample_flags_;
			t.track_id_ = fmp4_read_uint32(ptr + pos + 12);
			t.default_sample_description_index_ = fmp4_read_uint32(ptr + pos + 16);
			t.default_sample_duration_ = fmp4_read_uint32(ptr + pos + 20);
			t.default_sample_size_ = fmp4_read_uint32(ptr + pos + 24);
			t.default_sample_flags_ = fmp4_read_uint32(ptr + pos + 28);
			
			return t;
		}
		trex t = {};
		
		return t;

	}